

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void lowbd_inv_txfm2d_add_8x8_avx2
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  char in_CL;
  TX_SIZE in_stack_00000093;
  int in_stack_00000094;
  uint8_t *in_stack_00000098;
  int32_t *in_stack_000000a0;
  int in_stack_0000011c;
  TX_SIZE in_stack_00000122;
  TX_TYPE in_stack_00000123;
  int in_stack_00000124;
  uint8_t *in_stack_00000128;
  int32_t *in_stack_00000130;
  int in_stack_000004cc;
  TX_SIZE in_stack_000004d2;
  TX_TYPE in_stack_000004d3;
  int in_stack_000004d4;
  uint8_t *in_stack_000004d8;
  int32_t *in_stack_000004e0;
  int in_stack_000008cc;
  TX_SIZE in_stack_000008d2;
  TX_TYPE in_stack_000008d3;
  int in_stack_000008d4;
  uint8_t *in_stack_000008d8;
  int32_t *in_stack_000008e0;
  
  if (in_CL == '\t') {
    av1_lowbd_inv_txfm2d_add_idtx_ssse3
              (in_stack_000000a0,in_stack_00000098,in_stack_00000094,in_stack_00000093);
    return;
  }
  if (in_CL == '\n') {
LAB_009023be:
    av1_lowbd_inv_txfm2d_add_h_identity_ssse3
              (in_stack_000004e0,in_stack_000004d8,in_stack_000004d4,in_stack_000004d3,
               in_stack_000004d2,in_stack_000004cc);
  }
  else {
    if (in_CL != '\v') {
      if (in_CL == '\f') goto LAB_009023be;
      if (in_CL != '\r') {
        if (in_CL == '\x0e') goto LAB_009023be;
        if (in_CL != '\x0f') {
          lowbd_inv_txfm2d_8x8_no_identity_avx2
                    (in_stack_00000130,in_stack_00000128,in_stack_00000124,in_stack_00000123,
                     in_stack_00000122,in_stack_0000011c);
          return;
        }
      }
    }
    av1_lowbd_inv_txfm2d_add_v_identity_ssse3
              (in_stack_000008e0,in_stack_000008d8,in_stack_000008d4,in_stack_000008d3,
               in_stack_000008d2,in_stack_000008cc);
  }
  return;
}

Assistant:

static void lowbd_inv_txfm2d_add_8x8_avx2(const int32_t *input, uint8_t *output,
                                          int stride, TX_TYPE tx_type,
                                          TX_SIZE tx_size, int eob) {
  switch (tx_type) {
    case IDTX:
      av1_lowbd_inv_txfm2d_add_idtx_ssse3(input, output, stride, tx_size);

      break;
    case V_DCT:
    case V_ADST:
    case V_FLIPADST:
      av1_lowbd_inv_txfm2d_add_h_identity_ssse3(input, output, stride, tx_type,
                                                tx_size, eob);
      break;
    case H_DCT:
    case H_ADST:
    case H_FLIPADST:
      av1_lowbd_inv_txfm2d_add_v_identity_ssse3(input, output, stride, tx_type,
                                                tx_size, eob);
      break;
    default:
      lowbd_inv_txfm2d_8x8_no_identity_avx2(input, output, stride, tx_type,
                                            tx_size, eob);
  }
}